

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O2

void announce_login(CHAR_DATA *ch)

{
  bool bVar1;
  CHAR_DATA *ch_00;
  cabal_message *args;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> buffer;
  char *rstring;
  pointer local_48;
  size_type sStack_40;
  string local_38;
  
  if (ch->cabal < 8 && ch->cabal != 0) {
    bVar1 = is_immortal(ch);
    if (!bVar1) {
      ch_00 = get_cabal_guardian((int)ch->cabal);
      if (ch_00 != (CHAR_DATA *)0x0) {
        args = cabal_messages;
        rstring = talloc_string(cabal_messages[ch->cabal].login);
        ::fmt::v9::sprintf<char*,char*,char>(&buffer,(v9 *)&rstring,&ch->name,&args->login);
        local_48 = buffer._M_dataplus._M_p;
        sStack_40 = buffer._M_string_length;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)0x10;
        args_00.field_1.args_ = in_R9.args_;
        args_00.desc_ = (unsigned_long_long)&local_48;
        ::fmt::v9::vformat_abi_cxx11_(&local_38,(v9 *)"\x1b[1;37m{}\x1b[0;37m",fmt,args_00);
        std::__cxx11::string::operator=((string *)&buffer,(string *)&local_38);
        std::__cxx11::string::~string((string *)&local_38);
        do_cb(ch_00,buffer._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&buffer);
      }
    }
  }
  return;
}

Assistant:

void announce_login(CHAR_DATA *ch)
{
	CHAR_DATA *guardian;
	char *rstring;

	if (ch->cabal == 0 || ch->cabal > MAX_CABAL || is_immortal(ch))
		return;

	guardian = get_cabal_guardian(ch->cabal);

	if (!guardian)
		return;

	rstring = talloc_string(cabal_messages[ch->cabal].login);

	auto buffer = fmt::sprintf(rstring, ch->name);
	buffer = fmt::format("\x01B[1;37m{}\x01B[0;37m", buffer);
	do_cb(guardian, buffer.data());
}